

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Segment::QueueFrame(Segment *this,Frame *frame)

{
  int iVar1;
  Frame **ppFVar2;
  Frame **ppFVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar1 = this->frames_capacity_;
  uVar6 = this->frames_size_;
  if ((int)uVar6 < iVar1) {
    ppFVar3 = this->frames_;
    goto LAB_001504af;
  }
  uVar5 = 2;
  if (iVar1 != 0) {
    uVar5 = iVar1 * 2;
  }
  if (((int)uVar5 < 1) ||
     (ppFVar3 = (Frame **)operator_new__((ulong)uVar5 << 3,(nothrow_t *)&std::nothrow),
     ppFVar3 == (Frame **)0x0)) {
    return false;
  }
  ppFVar2 = this->frames_;
  if ((int)uVar6 < 1) {
    if (ppFVar2 != (Frame **)0x0) goto LAB_00150495;
  }
  else {
    uVar4 = 0;
    do {
      ppFVar3[uVar4] = ppFVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
LAB_00150495:
    operator_delete__(ppFVar2);
    uVar6 = this->frames_size_;
  }
  this->frames_ = ppFVar3;
  this->frames_capacity_ = uVar5;
LAB_001504af:
  this->frames_size_ = uVar6 + 1;
  ppFVar3[(int)uVar6] = frame;
  return true;
}

Assistant:

bool Segment::QueueFrame(Frame* frame) {
  const int32_t new_size = frames_size_ + 1;

  if (new_size > frames_capacity_) {
    // Add more frames.
    const int32_t new_capacity = (!frames_capacity_) ? 2 : frames_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    Frame** const frames = new (std::nothrow) Frame*[new_capacity];  // NOLINT
    if (!frames)
      return false;

    for (int32_t i = 0; i < frames_size_; ++i) {
      frames[i] = frames_[i];
    }

    delete[] frames_;
    frames_ = frames;
    frames_capacity_ = new_capacity;
  }

  frames_[frames_size_++] = frame;

  return true;
}